

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O0

void __thiscall
skiwi::anon_unknown_23::c_input_test_mix_ints_doubles::c_input_test_mix_ints_doubles
          (c_input_test_mix_ints_doubles *this)

{
  c_input_test_mix_ints_doubles *this_local;
  
  compile_fixture::compile_fixture(&this->super_compile_fixture);
  (this->super_compile_fixture)._vptr_compile_fixture =
       (_func_int **)&PTR__c_input_test_mix_ints_doubles_0032e7b0;
  return;
}

Assistant:

void test()
      {
      std::stringstream str;
      std::string script = R"(
(c-input "(int a, double b, int c, double d, int e, double f, int g, double h, int i, double j) " )

(+ a b c d e f g h i j)
)";
      bool error = false;
      asmcode code;
      try
        {
        code = get_asmcode(script);
        }
      catch (std::logic_error e)
        {
        error = true;
        str << e.what();
        }
      if (!error)
        {
        first_pass_data d;
        uint64_t size;
        fun_ptr f = (fun_ptr)assemble(size, d, code);
        if (f)
          {
          // important to cast to int64_t. Otherwise 32-bit version dword [rsp] is used to pass parameters, and there will be bagger in the upper half of the 64-bit register.
          uint64_t res = f(&ctxt, (int64_t)1, (double)2.1, (int64_t)3, (double)4.1, (int64_t)5, (double)6.1, (int64_t)7, (double)8.1, (int64_t)9, (double)10.1);
          scheme_runtime(res, str, env, rd, nullptr);        

          compiled_functions.emplace_back(f, size);
          }
        }
      TEST_EQ("55.5", str.str());
      }